

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

type __thiscall
chrono::ChValueSpecific<chrono::ChVector2<double>>::_archive_out<chrono::ChVector2<double>>
          (ChValueSpecific<chrono::ChVector2<double>> *this,ChArchiveOut *marchive)

{
  ChVector2<double>::ArchiveOUT(*(ChVector2<double> **)(this + 0x30),marchive);
  return;
}

Assistant:

typename enable_if< ChDetect_ArchiveOUT<Tc>::value, void >::type
        _archive_out(ChArchiveOut& marchive) {
            this->_ptr_to_val->ArchiveOUT(marchive);
        }